

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sandbox.cpp
# Opt level: O2

void __thiscall
Sandbox::replayPoke(Sandbox *this,AccessType type,u32 addr,u64 cycle,u32 fc,u16 value)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  InstrInfo IVar6;
  
  if (this->enabled == true) {
    IVar6 = moira::Moira::getInstrInfo(&moiracpu->super_Moira,::opcode);
    if ((IVar6.S != 4 || IVar6.I != CLR) && ((IVar6.I != CHK || (cpuModel == M68000)))) {
      uVar1 = this->recordCnt;
      uVar4 = 0;
      uVar5 = 0;
      if (0 < (int)uVar1) {
        uVar5 = (ulong)uVar1;
      }
      uVar2 = this->replayCnt;
      uVar3 = (ulong)uVar2;
      do {
        if (uVar5 == uVar4) {
LAB_0012d09d:
          error(this,type,addr,cycle,fc,value);
          return;
        }
        if ((((uVar3 == uVar4) && (this->access[uVar3].type == type)) &&
            (this->access[uVar3].addr == addr)) &&
           ((this->access[uVar3].value == value && (this->access[uVar3].fc == fc)))) {
          this->replayCnt = uVar2 + 1;
          if ((int)uVar2 < (int)uVar1) {
            return;
          }
          goto LAB_0012d09d;
        }
        uVar4 = uVar4 + 1;
      } while( true );
    }
  }
  return;
}

Assistant:

void
Sandbox::replayPoke(AccessType type, u32 addr, u64 cycle, u32 fc, u16 value)
{
    if (!enabled) return;

    auto info = moiracpu->getInstrInfo(opcode);

    // Ignore some opcodes that are handled differently by Moira
    if (info.I == Instr::CLR && info.S == Long) return;
    if (info.I == Instr::CHK && cpuModel != Model::M68000) return;

    for (int i = 0; i < recordCnt; i++) {

        // Enable for strict checking
        if (i != replayCnt) continue;

        // Check for a matching entry
        if (access[i].type != type) continue;
        if (access[i].addr != addr) continue;
        if (access[i].value != value) continue;
        if (access[i].fc != fc) continue;
        if (!MOIRA_MIMIC_MUSASHI) {
            if (access[i].cycle != cycle) continue;
        }

        // Match found
        replayCnt++;
        if (replayCnt > recordCnt) { break; }
        return;
    }

    error(type, addr, cycle, fc, value);
}